

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neverbleed.c
# Opt level: O2

void * daemon_conn_thread(void *_sock_fd)

{
  uint uVar1;
  long lVar2;
  undefined8 uVar3;
  byte bVar4;
  undefined8 *puVar5;
  uint8_t *puVar6;
  int iVar7;
  char *pcVar8;
  int *piVar9;
  RSA *rsa;
  uchar *puVar10;
  FILE *fp;
  rsa_st *r;
  EC_KEY *pEVar11;
  EC_POINT *pEVar12;
  BIGNUM *pBVar13;
  char *ptr;
  EC_KEY **ppEVar14;
  long lVar15;
  code *func;
  char *pcVar16;
  int fd;
  char *pcVar17;
  size_t key_index;
  ulong uVar18;
  size_t sStack_10100;
  passwd *pw;
  rsa_st *prStack_100e8;
  EVP_PKEY *pEStack_100e0;
  expbuf_t buf;
  BIGNUM *pBStack_100b0;
  size_t sStack_100a8;
  EC_GROUP *pEStack_10098;
  passwd pwbuf;
  uchar auth_token [32];
  char errbuf [256];
  
  buf.end = (char *)0x0;
  buf.capacity = 0;
  buf.buf = (char *)0x0;
  buf.start = (char *)0x0;
  fd = (int)_sock_fd;
  iVar7 = read_nbytes(fd,auth_token,0x20);
  if (iVar7 == 0) {
    iVar7 = bcmp(auth_token,(daemon_vars.nb)->auth_token,0x20);
    if (iVar7 == 0) {
      while( true ) {
        pcVar17 = "priv_enc_stub";
        iVar7 = expbuf_read(&buf,fd);
        if (iVar7 != 0) break;
        pcVar8 = expbuf_shift_str(&buf);
        if (pcVar8 == (char *)0x0) {
          piVar9 = __errno_location();
          *piVar9 = 0;
          pcVar17 = "failed to parse request";
          goto LAB_00183329;
        }
        iVar7 = strcmp(pcVar8,"priv_enc");
        if (iVar7 == 0) {
          func = RSA_private_encrypt;
LAB_001834e6:
          iVar7 = priv_encdec_stub(pcVar17,func,&buf);
          if (iVar7 != 0) goto LAB_00183330;
        }
        else {
          iVar7 = strcmp(pcVar8,"priv_dec");
          if (iVar7 == 0) {
            pcVar17 = "priv_dec_stub";
            func = RSA_private_decrypt;
            goto LAB_001834e6;
          }
          iVar7 = strcmp(pcVar8,"sign");
          if (iVar7 == 0) {
            pw._0_4_ = 0;
            if (7 < (ulong)((long)buf.end - (long)buf.start)) {
              uVar3 = *(undefined8 *)buf.start;
              buf.start = buf.start + 8;
              puVar10 = (uchar *)expbuf_shift_bytes(&buf,(size_t *)&pwbuf);
              if ((puVar10 != (uchar *)0x0) && (7 < (ulong)((long)buf.end - (long)buf.start))) {
                key_index = *(size_t *)buf.start;
                buf.start = buf.start + 8;
                rsa = (RSA *)daemon_get_rsa(key_index);
                if (rsa != (RSA *)0x0) {
                  iVar7 = RSA_sign((int)uVar3,puVar10,(uint)pwbuf.pw_name,(uchar *)errbuf,
                                   (uint *)&pw,rsa);
                  expbuf_dispose(&buf);
                  RSA_free(rsa);
                  expbuf_push_num(&buf,(long)iVar7);
                  uVar1 = (uint)pw;
                  if (iVar7 != 1) {
                    uVar1 = 0;
                  }
                  expbuf_push_bytes(&buf,errbuf,(ulong)uVar1);
                  goto LAB_00183d83;
                }
                piVar9 = __errno_location();
                *piVar9 = 0;
                pcVar17 = "sign_stub";
LAB_00183f31:
                warnf("%s: invalid key index:%zu",pcVar17,key_index);
                goto LAB_00183330;
              }
            }
            piVar9 = __errno_location();
            *piVar9 = 0;
            pcVar17 = "%s: failed to parse request";
            pcVar8 = "sign_stub";
LAB_00183fa7:
            warnf(pcVar17,pcVar8);
            goto LAB_00183330;
          }
          iVar7 = strcmp(pcVar8,"ecdsa_sign");
          if (iVar7 == 0) {
            pw._0_4_ = 0;
            if (7 < (ulong)((long)buf.end - (long)buf.start)) {
              uVar3 = *(undefined8 *)buf.start;
              buf.start = buf.start + 8;
              puVar10 = (uchar *)expbuf_shift_bytes(&buf,(size_t *)&pwbuf);
              if ((puVar10 != (uchar *)0x0) && (7 < (ulong)((long)buf.end - (long)buf.start))) {
                key_index = *(size_t *)buf.start;
                buf.start = buf.start + 8;
                pthread_mutex_lock((pthread_mutex_t *)&daemon_vars);
                pEVar11 = (EC_KEY *)daemon_vars.keys.ecdsa_keys[key_index];
                if (pEVar11 == (EC_KEY *)0x0) {
                  pthread_mutex_unlock((pthread_mutex_t *)&daemon_vars);
                  piVar9 = __errno_location();
                  *piVar9 = 0;
                  pcVar17 = "ecdsa_sign_stub";
                  goto LAB_00183f31;
                }
                EC_KEY_up_ref(pEVar11);
                pthread_mutex_unlock((pthread_mutex_t *)&daemon_vars);
                iVar7 = ECDSA_sign((int)uVar3,puVar10,(uint)pwbuf.pw_name,(uchar *)errbuf,
                                   (uint *)&pw,pEVar11);
                expbuf_dispose(&buf);
                EC_KEY_free(pEVar11);
                expbuf_push_num(&buf,(long)iVar7);
                uVar1 = (uint)pw;
                if (iVar7 != 1) {
                  uVar1 = 0;
                }
                expbuf_push_bytes(&buf,errbuf,(ulong)uVar1);
                goto LAB_00183d83;
              }
            }
            piVar9 = __errno_location();
            *piVar9 = 0;
            pcVar17 = "%s: failed to parse request";
            pcVar8 = "ecdsa_sign_stub";
            goto LAB_00183fa7;
          }
          iVar7 = strcmp(pcVar8,"del_ecdsa_key");
          if (iVar7 == 0) {
            if ((ulong)((long)buf.end - (long)buf.start) < 8) {
              piVar9 = __errno_location();
              *piVar9 = 0;
              pcVar17 = "%s: failed to parse request";
              pcVar8 = "del_ecdsa_key_stub";
              goto LAB_00183fa7;
            }
            uVar18 = *(ulong *)buf.start;
            buf.start = buf.start + 8;
            if ((daemon_vars.keys.ecdsa_keys == (EC_KEY **)0x0) ||
               (daemon_vars.keys.ecdsa_slots.reserved_size <= uVar18)) {
              piVar9 = __errno_location();
              *piVar9 = 0;
              pcVar17 = "del_ecdsa_key_stub";
LAB_001839f9:
              warnf("%s: invalid key index %zu",pcVar17,uVar18);
LAB_00183a03:
              sStack_10100 = 0;
            }
            else if ((daemon_vars.keys.ecdsa_slots.bita_avail[uVar18 >> 3] >> ((uint)uVar18 & 7) & 1
                     ) == 0) {
              pthread_mutex_lock((pthread_mutex_t *)&daemon_vars);
              daemon_vars.keys.ecdsa_slots.bita_avail[uVar18 >> 3] =
                   daemon_vars.keys.ecdsa_slots.bita_avail[uVar18 >> 3] |
                   '\x01' << ((byte)uVar18 & 7);
              daemon_vars.keys.ecdsa_slots.size = daemon_vars.keys.ecdsa_slots.size - 1;
              EC_KEY_free((EC_KEY *)daemon_vars.keys.ecdsa_keys[uVar18]);
              ppEVar14 = daemon_vars.keys.ecdsa_keys;
LAB_00183d54:
              ((RSA **)ppEVar14)[uVar18] = (RSA *)0x0;
              pthread_mutex_unlock((pthread_mutex_t *)&daemon_vars);
              sStack_10100 = 1;
            }
            else {
              pcVar17 = "del_ecdsa_key_stub";
LAB_00183934:
              warnf("%s: index not in use %zu",pcVar17,uVar18);
              sStack_10100 = 0;
            }
LAB_00183d70:
            expbuf_dispose(&buf);
            expbuf_push_num(&buf,sStack_10100);
          }
          else {
            iVar7 = strcmp(pcVar8,"load_key");
            if (iVar7 != 0) {
              iVar7 = strcmp(pcVar8,"del_rsa_key");
              if (iVar7 == 0) {
                if (7 < (ulong)((long)buf.end - (long)buf.start)) {
                  uVar18 = *(ulong *)buf.start;
                  buf.start = buf.start + 8;
                  if ((daemon_vars.keys.keys != (RSA **)0x0) &&
                     (uVar18 < daemon_vars.keys.rsa_slots.reserved_size)) {
                    if ((daemon_vars.keys.rsa_slots.bita_avail[uVar18 >> 3] >> ((uint)uVar18 & 7) &
                        1) == 0) {
                      pthread_mutex_lock((pthread_mutex_t *)&daemon_vars);
                      daemon_vars.keys.rsa_slots.bita_avail[uVar18 >> 3] =
                           daemon_vars.keys.rsa_slots.bita_avail[uVar18 >> 3] |
                           '\x01' << ((byte)uVar18 & 7);
                      daemon_vars.keys.rsa_slots.size = daemon_vars.keys.rsa_slots.size - 1;
                      RSA_free((RSA *)daemon_vars.keys.keys[uVar18]);
                      ppEVar14 = (EC_KEY **)daemon_vars.keys.keys;
                      goto LAB_00183d54;
                    }
                    pcVar17 = "del_rsa_key_stub";
                    goto LAB_00183934;
                  }
                  piVar9 = __errno_location();
                  *piVar9 = 0;
                  pcVar17 = "del_rsa_key_stub";
                  goto LAB_001839f9;
                }
                piVar9 = __errno_location();
                *piVar9 = 0;
                pcVar17 = "%s: failed to parse request";
                pcVar8 = "del_rsa_key_stub";
              }
              else {
                iVar7 = strcmp(pcVar8,"setuidgid");
                if (iVar7 == 0) {
                  pcVar17 = expbuf_shift_str(&buf);
                  if ((pcVar17 != (char *)0x0) && (7 < (ulong)((long)buf.end - (long)buf.start))) {
                    lVar2 = *(long *)buf.start;
                    buf.start = buf.start + 8;
                    piVar9 = __errno_location();
                    *piVar9 = 0;
                    iVar7 = getpwnam_r(pcVar17,(passwd *)&pwbuf,errbuf,0x10000,(passwd **)&pw);
                    if (iVar7 == 0) {
                      lVar15 = CONCAT44(pw._4_4_,(uint)pw);
                      if (lVar15 != 0) {
                        if (lVar2 != 0) {
                          iVar7 = chown(((daemon_vars.nb)->sun_).sun_path,
                                        *(__uid_t *)(lVar15 + 0x10),*(__gid_t *)(lVar15 + 0x14));
                          pcVar17 = ((daemon_vars.nb)->sun_).sun_path;
                          if (iVar7 != 0) {
LAB_00183fd4:
                            dief("chown failed for:%s",pcVar17);
                          }
                          pcVar17 = dirname(pcVar17);
                          iVar7 = chown(pcVar17,*(__uid_t *)(CONCAT44(pw._4_4_,(uint)pw) + 0x10),
                                        *(__gid_t *)(CONCAT44(pw._4_4_,(uint)pw) + 0x14));
                          if (iVar7 != 0) goto LAB_00183fd4;
                          free(pcVar17);
                          lVar15 = CONCAT44(pw._4_4_,(uint)pw);
                        }
                        iVar7 = setgid(*(__gid_t *)(lVar15 + 0x14));
                        puVar5 = (undefined8 *)CONCAT44(pw._4_4_,(uint)pw);
                        if (iVar7 == 0) {
                          iVar7 = initgroups((char *)*puVar5,*(__gid_t *)((long)puVar5 + 0x14));
                          if (iVar7 == 0) {
                            iVar7 = setuid(*(__uid_t *)
                                            ((undefined8 *)CONCAT44(pw._4_4_,(uint)pw) + 2));
                            if (iVar7 == 0) goto LAB_00183a03;
                            uVar1 = *(uint *)(CONCAT44(pw._4_4_,(uint)pw) + 0x10);
                            pcVar17 = "%s: setuid(%d) failed\n";
                            goto LAB_00183dc4;
                          }
                          warnf("%s: initgroups(%s, %d) failed","setuidgid_stub",
                                *(undefined8 *)CONCAT44(pw._4_4_,(uint)pw));
                        }
                        else {
                          uVar1 = *(uint *)((long)puVar5 + 0x14);
                          pcVar17 = "%s: setgid(%d) failed";
LAB_00183dc4:
                          warnf(pcVar17,"setuidgid_stub",(ulong)uVar1);
                        }
                        sStack_10100 = 0xffffffffffffffff;
                        goto LAB_00183d70;
                      }
                      warnf("%s: failed to obtain information of user:%s","setuidgid_stub",pcVar17);
                    }
                    else {
                      warnf("%s: getpwnam_r failed","setuidgid_stub");
                    }
                    sStack_10100 = 0xffffffffffffffff;
                    goto LAB_00183d70;
                  }
                  piVar9 = __errno_location();
                  *piVar9 = 0;
                  pcVar17 = "%s: failed to parse request";
                  pcVar8 = "setuidgid_stub";
                }
                else {
                  pcVar17 = "unknown command:%s";
                }
              }
              goto LAB_00183fa7;
            }
            memset(errbuf,0,0x100);
            pcVar17 = expbuf_shift_str(&buf);
            if (pcVar17 == (char *)0x0) {
              pcVar17 = "%s: failed to parse request";
              pcVar8 = "load_key_stub";
              goto LAB_00183fa7;
            }
            fp = fopen(pcVar17,"rt");
            if (fp == (FILE *)0x0) {
              piVar9 = __errno_location();
              strerror_r(*piVar9,errbuf,0x100);
LAB_00183a6d:
              prStack_100e8 = (rsa_st *)0x0;
              sStack_100a8 = 0xffffffffffffffff;
              pcVar17 = (char *)0x0;
              pcVar8 = (char *)0x0;
              sStack_10100 = 0;
              pEStack_100e0 = (EVP_PKEY *)0x0;
LAB_00183a90:
              pBStack_100b0 = (BIGNUM *)0x0;
LAB_00183a99:
              ptr = (char *)0x0;
            }
            else {
              pEStack_100e0 = PEM_read_PrivateKey(fp,(EVP_PKEY **)0x0,(undefined1 *)0x0,(void *)0x0)
              ;
              if (pEStack_100e0 == (EVP_PKEY *)0x0) {
                builtin_strncpy(errbuf + 0x10,"the private key",0x10);
                builtin_strncpy(errbuf,"failed to parse ",0x10);
                goto LAB_00183a6d;
              }
              iVar7 = EVP_PKEY_get_base_id(pEStack_100e0);
              if (iVar7 != 0x198) {
                if (iVar7 == 6) {
                  r = EVP_PKEY_get1_RSA(pEStack_100e0);
                  pthread_mutex_lock((pthread_mutex_t *)&daemon_vars);
                  adjust_slots_reserved_size(1,&daemon_vars.keys.rsa_slots);
                  puVar6 = daemon_vars.keys.rsa_slots.bita_avail;
                  sStack_100a8 = bita_ffirst(daemon_vars.keys.rsa_slots.bita_avail,
                                             daemon_vars.keys.rsa_slots.reserved_size,0);
                  if (sStack_100a8 == 0xffffffffffffffff) goto LAB_00183fb3;
                  bVar4 = (byte)sStack_100a8 & 7;
                  puVar6[sStack_100a8 >> 3] =
                       puVar6[sStack_100a8 >> 3] & (-2 << bVar4 | 0xfeU >> 8 - bVar4);
                  daemon_vars.keys.rsa_slots.size = daemon_vars.keys.rsa_slots.size + 1;
                  daemon_vars.keys.keys[sStack_100a8] = (RSA *)r;
                  RSA_up_ref(r);
                  pthread_mutex_unlock((pthread_mutex_t *)&daemon_vars);
                  prStack_100e8 = r;
                  RSA_get0_key(r,&pw,&pwbuf);
                  pcVar17 = BN_bn2hex((BIGNUM *)CONCAT44(pwbuf.pw_name._4_4_,(uint)pwbuf.pw_name));
                  pcVar8 = BN_bn2hex((BIGNUM *)CONCAT44(pw._4_4_,(uint)pw));
                  sStack_10100 = 1;
                }
                else {
                  EVP_PKEY_get_base_id(pEStack_100e0);
                  snprintf(errbuf,0x100,"unsupported private key: %d");
                  prStack_100e8 = (rsa_st *)0x0;
                  sStack_100a8 = 0xffffffffffffffff;
                  pcVar17 = (char *)0x0;
                  pcVar8 = (char *)0x0;
                  sStack_10100 = 0;
                }
                goto LAB_00183a90;
              }
              pEVar11 = (EC_KEY *)EVP_PKEY_get0_EC_KEY(pEStack_100e0);
              pthread_mutex_lock((pthread_mutex_t *)&daemon_vars);
              adjust_slots_reserved_size(2,&daemon_vars.keys.ecdsa_slots);
              puVar6 = daemon_vars.keys.ecdsa_slots.bita_avail;
              sStack_100a8 = bita_ffirst(daemon_vars.keys.ecdsa_slots.bita_avail,
                                         daemon_vars.keys.ecdsa_slots.reserved_size,0);
              if (sStack_100a8 == 0xffffffffffffffff) {
LAB_00183fb3:
                dief("no available slot for key");
              }
              bVar4 = (byte)sStack_100a8 & 7;
              puVar6[sStack_100a8 >> 3] =
                   puVar6[sStack_100a8 >> 3] & (-2 << bVar4 | 0xfeU >> 8 - bVar4);
              daemon_vars.keys.ecdsa_slots.size = daemon_vars.keys.ecdsa_slots.size + 1;
              daemon_vars.keys.ecdsa_keys[sStack_100a8] = (EC_KEY *)pEVar11;
              EC_KEY_up_ref(pEVar11);
              pthread_mutex_unlock((pthread_mutex_t *)&daemon_vars);
              pEStack_10098 = EC_KEY_get0_group(pEVar11);
              pEVar12 = EC_KEY_get0_public_key(pEVar11);
              pBStack_100b0 = BN_new();
              pBVar13 = EC_POINT_point2bn(pEStack_10098,pEVar12,POINT_CONVERSION_COMPRESSED,
                                          pBStack_100b0,(BN_CTX *)0x0);
              if (pBVar13 == (BIGNUM *)0x0) {
                errbuf[0x25] = ' ';
                errbuf[0x26] = 'B';
                errbuf[0x27] = 'I';
                errbuf[0x28] = 'G';
                errbuf[0x29] = 'N';
                errbuf[0x2a] = 'U';
                errbuf[0x2b] = 'M';
                errbuf[0x2c] = '\0';
                builtin_strncpy(errbuf + 0x20,"ey to",5);
                errbuf[0x10] = 't';
                errbuf[0x11] = ' ';
                errbuf[0x12] = 'E';
                errbuf[0x13] = 'C';
                errbuf[0x14] = 'D';
                errbuf[0x15] = 'S';
                errbuf[0x16] = 'A';
                errbuf[0x17] = ' ';
                builtin_strncpy(errbuf + 0x18,"public k",8);
                errbuf[0] = 'f';
                errbuf[1] = 'a';
                errbuf[2] = 'i';
                errbuf[3] = 'l';
                errbuf[4] = 'e';
                errbuf[5] = 'd';
                errbuf[6] = ' ';
                errbuf[7] = 't';
                errbuf[8] = 'o';
                errbuf[9] = ' ';
                errbuf[10] = 'c';
                errbuf[0xb] = 'o';
                errbuf[0xc] = 'n';
                errbuf[0xd] = 'v';
                errbuf[0xe] = 'e';
                errbuf[0xf] = 'r';
                prStack_100e8 = (rsa_st *)0x0;
                pcVar17 = (char *)0x0;
                pcVar8 = (char *)0x0;
                sStack_10100 = 0;
                goto LAB_00183a99;
              }
              ptr = BN_bn2hex(pBStack_100b0);
              prStack_100e8 = (rsa_st *)0x0;
              pcVar17 = (char *)0x0;
              pcVar8 = (char *)0x0;
              sStack_10100 = 2;
            }
            expbuf_dispose(&buf);
            expbuf_push_num(&buf,sStack_10100);
            expbuf_push_num(&buf,sStack_100a8);
            if (sStack_10100 == 2) {
              iVar7 = EC_GROUP_get_curve_name(pEStack_10098);
              expbuf_push_num(&buf,(long)iVar7);
              pcVar16 = ptr;
            }
            else if ((int)sStack_10100 == 1) {
              pcVar16 = pcVar17;
              if (pcVar17 == (char *)0x0) {
                pcVar16 = "";
              }
              expbuf_push_str(&buf,pcVar16);
              pcVar16 = pcVar8;
              if (pcVar8 == (char *)0x0) {
                pcVar16 = "";
              }
            }
            else {
              pcVar16 = errbuf;
            }
            expbuf_push_str(&buf,pcVar16);
            if (prStack_100e8 != (RSA *)0x0) {
              RSA_free(prStack_100e8);
            }
            if (pEStack_100e0 != (EVP_PKEY *)0x0) {
              EVP_PKEY_free(pEStack_100e0);
            }
            if (pcVar17 != (char *)0x0) {
              CRYPTO_free(pcVar17);
            }
            if (pcVar8 != (char *)0x0) {
              CRYPTO_free(pcVar8);
            }
            if (ptr != (char *)0x0) {
              CRYPTO_free(ptr);
            }
            if (pBStack_100b0 != (BIGNUM *)0x0) {
              BN_free(pBStack_100b0);
            }
            if (fp != (FILE *)0x0) {
              fclose(fp);
            }
          }
        }
LAB_00183d83:
        iVar7 = expbuf_write(&buf,fd);
        if (iVar7 != 0) {
          piVar9 = __errno_location();
          pcVar17 = "write error";
          if (*piVar9 == 0) {
            pcVar17 = "connection closed by client";
          }
          goto LAB_00183329;
        }
        expbuf_dispose(&buf);
      }
      piVar9 = __errno_location();
      if (*piVar9 == 0) goto LAB_00183330;
      pcVar17 = "read error";
    }
    else {
      pcVar17 = "client authentication failed";
    }
  }
  else {
    pcVar17 = "failed to receive authencication token from client";
  }
LAB_00183329:
  warnf(pcVar17);
LAB_00183330:
  expbuf_dispose(&buf);
  close(fd);
  return (void *)0x0;
}

Assistant:

static void *daemon_conn_thread(void *_sock_fd)
{
    int sock_fd = (int)((char *)_sock_fd - (char *)NULL);
    struct expbuf_t buf = {NULL};
    unsigned char auth_token[NEVERBLEED_AUTH_TOKEN_SIZE];

    /* authenticate */
    if (read_nbytes(sock_fd, &auth_token, sizeof(auth_token)) != 0) {
        warnf("failed to receive authencication token from client");
        goto Exit;
    }
    if (memcmp(auth_token, daemon_vars.nb->auth_token, NEVERBLEED_AUTH_TOKEN_SIZE) != 0) {
        warnf("client authentication failed");
        goto Exit;
    }

    while (1) {
        char *cmd;
        if (expbuf_read(&buf, sock_fd) != 0) {
            if (errno != 0)
                warnf("read error");
            break;
        }
        if ((cmd = expbuf_shift_str(&buf)) == NULL) {
            errno = 0;
            warnf("failed to parse request");
            break;
        }
        if (strcmp(cmd, "priv_enc") == 0) {
            if (priv_enc_stub(&buf) != 0)
                break;
        } else if (strcmp(cmd, "priv_dec") == 0) {
            if (priv_dec_stub(&buf) != 0)
                break;
        } else if (strcmp(cmd, "sign") == 0) {
            if (sign_stub(&buf) != 0)
                break;
#if OPENSSL_1_1_API
        } else if (strcmp(cmd, "ecdsa_sign") == 0) {
            if (ecdsa_sign_stub(&buf) != 0)
                break;
        } else if (strcmp(cmd, "del_ecdsa_key") == 0) {
            if (del_ecdsa_key_stub(&buf) != 0)
                break;
#endif
        } else if (strcmp(cmd, "load_key") == 0) {
            if (load_key_stub(&buf) != 0)
                break;
        } else if (strcmp(cmd, "del_rsa_key") == 0) {
            if (del_rsa_key_stub(&buf) != 0)
                break;
        } else if (strcmp(cmd, "setuidgid") == 0) {
            if (setuidgid_stub(&buf) != 0)
                break;
        } else {
            warnf("unknown command:%s", cmd);
            break;
        }
        if (expbuf_write(&buf, sock_fd) != 0) {
            warnf(errno != 0 ? "write error" : "connection closed by client");
            break;
        }
        expbuf_dispose(&buf);
    }

Exit:
    expbuf_dispose(&buf);
    close(sock_fd);

    return NULL;
}